

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_basics.cpp
# Opt level: O2

Am_Object copy_command_tree(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object *in_RSI;
  Am_Object child_copy;
  Am_Object parent;
  Am_Object child;
  Am_Value value;
  Am_Object local_38;
  
  Am_Object::Copy_Value_Only((Am_Object *)&value,(char *)in_RSI);
  Am_Object::operator=(in_RSI,(Am_Object *)&value);
  Am_Object::~Am_Object((Am_Object *)&value);
  child.data = (Am_Object_Data *)0x0;
  parent.data = (Am_Object_Data *)0x0;
  child_copy.data = (Am_Object_Data *)0x0;
  Am_Object::operator=(&parent,in_RSI);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  while( true ) {
    in_value = Am_Object::Get(&parent,0x167,1);
    Am_Value::operator=(&value,in_value);
    bVar1 = Am_Value::Valid(&value);
    if (!bVar1 || value.type != 0xa001) break;
    Am_Object::operator=(&child,&value);
    Am_Object::Copy_Value_Only(&local_38,(char *)&child);
    Am_Object::operator=(&child_copy,&local_38);
    Am_Object::~Am_Object(&local_38);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&child_copy);
    Am_Object::Set(&parent,0x167,pAVar2,0);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&parent);
    Am_Object::Set(&child_copy,0x154,pAVar2,0);
    Am_Object::operator=(&parent,&child_copy);
  }
  Am_Object::Am_Object(command_obj,in_RSI);
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&child_copy);
  Am_Object::~Am_Object(&parent);
  Am_Object::~Am_Object(&child);
  return (Am_Object)(Am_Object_Data *)command_obj;
}

Assistant:

Am_Object
copy_command_tree(Am_Object command_obj)
{
  command_obj = command_obj.Copy_Value_Only();
  Am_Object child, parent, child_copy;
  parent = command_obj;
  Am_Value value;
  while (true) {
    value = parent.Peek(Am_IMPLEMENTATION_CHILD);
    if (value.Valid() && value.type == Am_OBJECT) {
      child = value;
      child_copy = child.Copy_Value_Only();
      parent.Set(Am_IMPLEMENTATION_CHILD, child_copy);
      child_copy.Set(Am_IMPLEMENTATION_PARENT, parent);
      parent = child_copy;
    } else
      break; //leave loop
  }
  return command_obj;
}